

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O2

void __thiscall btVectorX<float>::resize(btVectorX<float> *this,int rows)

{
  uint in_EAX;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  btAlignedObjectArray<float>::resize(&this->m_storage,rows,(float *)((long)&uStack_8 + 4));
  return;
}

Assistant:

void resize(int rows)
	{
		m_storage.resize(rows);
	}